

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall
sf::Texture::update(Texture *this,Uint8 *pixels,uint width,uint height,uint x,uint y)

{
  Uint64 UVar1;
  GLsizei in_ECX;
  GLsizei in_EDX;
  void *in_RSI;
  long in_RDI;
  GLint in_R8D;
  GLint in_R9D;
  TextureSaver save;
  TransientContextLock lock;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  TransientContextLock *in_stack_ffffffffffffffb0;
  
  if ((in_RSI != (void *)0x0) && (*(int *)(in_RDI + 0x10) != 0)) {
    GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffffb0);
    priv::TextureSaver::TextureSaver((TextureSaver *)0x2ab339);
    (*sf_glad_glBindTexture)(0xde1,*(GLuint *)(in_RDI + 0x10));
    uVar2 = 0x1401;
    (*sf_glad_glTexSubImage2D)(0xde1,0,in_R8D,in_R9D,in_EDX,in_ECX,0x1908,0x1401,in_RSI);
    (*sf_glad_glTexParameteri)(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
    *(undefined1 *)(in_RDI + 0x19) = 0;
    *(undefined1 *)(in_RDI + 0x17) = 0;
    UVar1 = anon_unknown.dwarf_206a86::TextureImpl::getUniqueId();
    *(Uint64 *)(in_RDI + 0x20) = UVar1;
    (*sf_glad_glFlush)();
    priv::TextureSaver::~TextureSaver((TextureSaver *)0x2ab3ff);
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
  }
  return;
}

Assistant:

void Texture::update(const Uint8* pixels, unsigned int width, unsigned int height, unsigned int x, unsigned int y)
{
    assert(x + width <= m_size.x);
    assert(y + height <= m_size.y);

    if (pixels && m_texture)
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the given array to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, static_cast<GLint>(x), static_cast<GLint>(y), static_cast<GLsizei>(width), static_cast<GLsizei>(height), GL_RGBA, GL_UNSIGNED_BYTE, pixels));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = TextureImpl::getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}